

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O1

timeval __thiscall hrgls::datablob::DataBlob::Time(DataBlob *this)

{
  timeval tVar1;
  hrgls_Status hVar2;
  DataBlob_private *pDVar3;
  timeval ret;
  __time_t local_18;
  __suseconds_t _Stack_10;
  
  local_18 = 0;
  _Stack_10 = 0;
  pDVar3 = this->m_private;
  if (pDVar3->blob == (hrgls_DataBlob)0x0) {
    hVar2 = 0x3ee;
  }
  else {
    hVar2 = hrgls_DataBlobGetTime(pDVar3->blob,&local_18);
    pDVar3 = this->m_private;
  }
  pDVar3->status = hVar2;
  tVar1.tv_usec = _Stack_10;
  tVar1.tv_sec = local_18;
  return tVar1;
}

Assistant:

struct timeval DataBlob::Time() const
    {
      struct timeval ret = {};
      if (!m_private->blob) {
        m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
        return ret;
      }
      if (hrgls_STATUS_OKAY !=
        (m_private->status = hrgls_DataBlobGetTime(m_private->blob, &ret))) {
        return ret;
      }
      return ret;
    }